

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

bool __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::operator!=
          (InputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *rhs)

{
  double dVar1;
  double dVar2;
  __optional_eq_t<std::vector<std::array<double,_3UL>_>,_std::vector<std::array<double,_3UL>_>_>
  _Var3;
  __optional_eq_t<std::vector<double>,_std::vector<double>_> _Var4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)(this->current_position)._M_elems + lVar5);
    dVar2 = *(double *)((long)(rhs->current_position)._M_elems + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  bVar6 = true;
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    lVar5 = 0;
    do {
      dVar1 = *(double *)((long)(this->current_velocity)._M_elems + lVar5);
      dVar2 = *(double *)((long)(rhs->current_velocity)._M_elems + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar7 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar7);
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      lVar5 = 0;
      do {
        dVar1 = *(double *)((long)(this->current_acceleration)._M_elems + lVar5);
        dVar2 = *(double *)((long)(rhs->current_acceleration)._M_elems + lVar5);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar7 = lVar5 != 0x10;
        lVar5 = lVar5 + 8;
      } while (bVar7);
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        lVar5 = 0;
        do {
          dVar1 = *(double *)((long)(this->target_position)._M_elems + lVar5);
          dVar2 = *(double *)((long)(rhs->target_position)._M_elems + lVar5);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar7 = lVar5 != 0x10;
          lVar5 = lVar5 + 8;
        } while (bVar7);
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
          lVar5 = 0;
          do {
            dVar1 = *(double *)((long)(this->target_velocity)._M_elems + lVar5);
            dVar2 = *(double *)((long)(rhs->target_velocity)._M_elems + lVar5);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar7 = lVar5 != 0x10;
            lVar5 = lVar5 + 8;
          } while (bVar7);
          if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
            lVar5 = 0;
            do {
              dVar1 = *(double *)((long)(this->target_acceleration)._M_elems + lVar5);
              dVar2 = *(double *)((long)(rhs->target_acceleration)._M_elems + lVar5);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar7 = lVar5 != 0x10;
              lVar5 = lVar5 + 8;
            } while (bVar7);
            if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
              lVar5 = 0;
              do {
                dVar1 = *(double *)((long)(this->max_velocity)._M_elems + lVar5);
                dVar2 = *(double *)((long)(rhs->max_velocity)._M_elems + lVar5);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar7 = lVar5 != 0x10;
                lVar5 = lVar5 + 8;
              } while (bVar7);
              if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
                lVar5 = 0;
                do {
                  dVar1 = *(double *)((long)(this->max_acceleration)._M_elems + lVar5);
                  dVar2 = *(double *)((long)(rhs->max_acceleration)._M_elems + lVar5);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar7 = lVar5 != 0x10;
                  lVar5 = lVar5 + 8;
                } while (bVar7);
                if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
                  lVar5 = 0;
                  do {
                    dVar1 = *(double *)((long)(this->max_jerk)._M_elems + lVar5);
                    dVar2 = *(double *)((long)(rhs->max_jerk)._M_elems + lVar5);
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                    bVar7 = lVar5 != 0x10;
                    lVar5 = lVar5 + 8;
                  } while (bVar7);
                  if ((((((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) &&
                        (bVar7 = std::operator==(&this->intermediate_positions,
                                                 &rhs->intermediate_positions), bVar7)) &&
                       (((_Var3 = std::operator==(&this->per_section_max_velocity,
                                                  &rhs->per_section_max_velocity), _Var3 &&
                         (_Var3 = std::operator==(&this->per_section_max_acceleration,
                                                  &rhs->per_section_max_acceleration), _Var3)) &&
                        ((_Var3 = std::operator==(&this->per_section_max_jerk,
                                                  &rhs->per_section_max_jerk), _Var3 &&
                         ((_Var3 = std::operator==(&this->per_section_min_velocity,
                                                   &rhs->per_section_min_velocity), _Var3 &&
                          (_Var3 = std::operator==(&this->per_section_min_acceleration,
                                                   &rhs->per_section_min_acceleration), _Var3)))))))
                       ) && (_Var3 = std::operator==(&this->per_section_max_position,
                                                     &rhs->per_section_max_position), _Var3)) &&
                     (_Var3 = std::operator==(&this->per_section_min_position,
                                              &rhs->per_section_min_position), _Var3)) {
                    bVar7 = (this->max_position).
                            super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
                            super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged;
                    bVar8 = bVar7 == (rhs->max_position).
                                     super__Optional_base<std::array<double,_3UL>,_true,_true>.
                                     _M_payload.
                                     super__Optional_payload_base<std::array<double,_3UL>_>.
                                     _M_engaged;
                    if ((bVar7 & bVar8) == 1) {
                      lVar5 = 0;
                      do {
                        dVar1 = *(double *)((this->enabled)._M_elems + lVar5 + -0x40);
                        dVar2 = *(double *)((rhs->enabled)._M_elems + lVar5 + -0x40);
                        bVar8 = dVar1 == dVar2;
                        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                        bVar7 = lVar5 != 0x10;
                        lVar5 = lVar5 + 8;
                      } while (bVar7);
                    }
                    if (bVar8) {
                      bVar7 = (this->min_position).
                              super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
                              super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged;
                      bVar8 = bVar7 == (rhs->min_position).
                                       super__Optional_base<std::array<double,_3UL>,_true,_true>.
                                       _M_payload.
                                       super__Optional_payload_base<std::array<double,_3UL>_>.
                                       _M_engaged;
                      if ((bVar7 & bVar8) == 1) {
                        lVar5 = 0;
                        do {
                          dVar1 = *(double *)((this->enabled)._M_elems + lVar5 + -0x20);
                          dVar2 = *(double *)((rhs->enabled)._M_elems + lVar5 + -0x20);
                          bVar8 = dVar1 == dVar2;
                          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                          bVar7 = lVar5 != 0x10;
                          lVar5 = lVar5 + 8;
                        } while (bVar7);
                      }
                      if ((bVar8) &&
                         ((this->enabled)._M_elems[2] == (rhs->enabled)._M_elems[2] &&
                          *(short *)(this->enabled)._M_elems == *(short *)(rhs->enabled)._M_elems))
                      {
                        bVar7 = (this->minimum_duration).super__Optional_base<double,_true,_true>.
                                _M_payload.super__Optional_payload_base<double>._M_engaged;
                        bVar8 = (rhs->minimum_duration).super__Optional_base<double,_true,_true>.
                                _M_payload.super__Optional_payload_base<double>._M_engaged;
                        if (bVar7 == bVar8 && bVar7 == true) {
                          dVar1 = (this->minimum_duration).super__Optional_base<double,_true,_true>.
                                  _M_payload.super__Optional_payload_base<double>._M_payload.
                                  _M_value;
                          if (dVar1 != (rhs->minimum_duration).
                                       super__Optional_base<double,_true,_true>._M_payload.
                                       super__Optional_payload_base<double>._M_payload._M_value) {
                            return true;
                          }
                          if (NAN(dVar1) ||
                              NAN((rhs->minimum_duration).super__Optional_base<double,_true,_true>.
                                  _M_payload.super__Optional_payload_base<double>._M_payload.
                                  _M_value)) {
                            return true;
                          }
                        }
                        else if (bVar7 != bVar8) {
                          return true;
                        }
                        _Var4 = std::operator==(&this->per_section_minimum_duration,
                                                &rhs->per_section_minimum_duration);
                        if (_Var4) {
                          bVar7 = (this->min_velocity).
                                  super__Optional_base<std::array<double,_3UL>,_true,_true>.
                                  _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>.
                                  _M_engaged;
                          bVar8 = bVar7 == (rhs->min_velocity).
                                           super__Optional_base<std::array<double,_3UL>,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<std::array<double,_3UL>_>.
                                           _M_engaged;
                          if ((bVar7 & bVar8) == 1) {
                            lVar5 = 0;
                            do {
                              dVar1 = *(double *)
                                       ((long)&(((optional<std::array<double,_3UL>_> *)
                                                (&this->max_jerk + 1))->
                                               super__Optional_base<std::array<double,_3UL>,_true,_true>
                                               )._M_payload.
                                               super__Optional_payload_base<std::array<double,_3UL>_>
                                               ._M_payload + lVar5);
                              dVar2 = *(double *)
                                       ((long)&(((optional<std::array<double,_3UL>_> *)
                                                (&rhs->max_jerk + 1))->
                                               super__Optional_base<std::array<double,_3UL>,_true,_true>
                                               )._M_payload.
                                               super__Optional_payload_base<std::array<double,_3UL>_>
                                               ._M_payload + lVar5);
                              bVar8 = dVar1 == dVar2;
                              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                              bVar7 = lVar5 != 0x10;
                              lVar5 = lVar5 + 8;
                            } while (bVar7);
                          }
                          if (bVar8) {
                            bVar7 = (this->min_acceleration).
                                    super__Optional_base<std::array<double,_3UL>,_true,_true>.
                                    _M_payload.
                                    super__Optional_payload_base<std::array<double,_3UL>_>.
                                    _M_engaged;
                            bVar8 = bVar7 == (rhs->min_acceleration).
                                             super__Optional_base<std::array<double,_3UL>,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<std::array<double,_3UL>_>.
                                             _M_engaged;
                            if ((bVar7 & bVar8) == 1) {
                              lVar5 = 0;
                              do {
                                dVar1 = *(double *)((long)(&this->max_jerk + 2) + lVar5 + 8);
                                dVar2 = *(double *)((long)(&rhs->max_jerk + 2) + lVar5 + 8);
                                bVar8 = dVar1 == dVar2;
                                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                                bVar7 = lVar5 != 0x10;
                                lVar5 = lVar5 + 8;
                              } while (bVar7);
                            }
                            if ((((bVar8) && (this->control_interface == rhs->control_interface)) &&
                                (this->synchronization == rhs->synchronization)) &&
                               (this->duration_discretization == rhs->duration_discretization)) {
                              bVar7 = (this->per_dof_control_interface).
                                      super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>
                                      ._M_engaged;
                              bVar8 = bVar7 == (rhs->per_dof_control_interface).
                                               super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>
                                               ._M_engaged;
                              if ((bVar7 & bVar8) == 1) {
                                lVar5 = 0;
                                do {
                                  bVar8 = *(int *)((long)(&this->enabled + 1) + lVar5 + 1) ==
                                          *(int *)((long)(&rhs->enabled + 1) + lVar5 + 1);
                                  if (!bVar8) break;
                                  bVar7 = lVar5 != 8;
                                  lVar5 = lVar5 + 4;
                                } while (bVar7);
                              }
                              if (bVar8) {
                                bVar7 = (this->per_dof_synchronization).
                                        super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>
                                        ._M_payload.
                                        super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>
                                        ._M_engaged;
                                bVar6 = bVar7 == (rhs->per_dof_synchronization).
                                                 super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>
                                                 ._M_payload.
                                                 super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>
                                                 ._M_engaged;
                                if ((bVar7 & bVar6) == 1) {
                                  lVar5 = 0;
                                  do {
                                    bVar6 = *(int *)((long)(&this->enabled + 6) + lVar5 + 2) ==
                                            *(int *)((long)(&rhs->enabled + 6) + lVar5 + 2);
                                    if (!bVar6) break;
                                    bVar7 = lVar5 != 8;
                                    lVar5 = lVar5 + 4;
                                  } while (bVar7);
                                }
                                bVar6 = (bool)(bVar6 ^ 1);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool operator!=(const InputParameter<DOFs, CustomVector>& rhs) const {
        return !(
            current_position == rhs.current_position
            && current_velocity == rhs.current_velocity
            && current_acceleration == rhs.current_acceleration
            && target_position == rhs.target_position
            && target_velocity == rhs.target_velocity
            && target_acceleration == rhs.target_acceleration
            && max_velocity == rhs.max_velocity
            && max_acceleration == rhs.max_acceleration
            && max_jerk == rhs.max_jerk
            && intermediate_positions == rhs.intermediate_positions
            && per_section_max_velocity == rhs.per_section_max_velocity
            && per_section_max_acceleration == rhs.per_section_max_acceleration
            && per_section_max_jerk == rhs.per_section_max_jerk
            && per_section_min_velocity == rhs.per_section_min_velocity
            && per_section_min_acceleration == rhs.per_section_min_acceleration
            && per_section_max_position == rhs.per_section_max_position
            && per_section_min_position == rhs.per_section_min_position
            && max_position == rhs.max_position
            && min_position == rhs.min_position
            && enabled == rhs.enabled
            && minimum_duration == rhs.minimum_duration
            && per_section_minimum_duration == rhs.per_section_minimum_duration
            && min_velocity == rhs.min_velocity
            && min_acceleration == rhs.min_acceleration
            && control_interface == rhs.control_interface
            && synchronization == rhs.synchronization
            && duration_discretization == rhs.duration_discretization
            && per_dof_control_interface == rhs.per_dof_control_interface
            && per_dof_synchronization == rhs.per_dof_synchronization
        );
    }